

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text)

{
  bool bVar1;
  char *in_RSI;
  Parser *in_RDI;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Parser *in_stack_ffffffffffffff70;
  undefined1 local_79 [33];
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  
  local_18 = in_RSI;
  bVar1 = TryConsume(in_RDI,in_stack_ffffffffffffff60);
  if (!bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_79 + 1),local_18,(allocator *)__rhs);
    std::operator+((char *)in_RDI,__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (char *)__rhs);
    AddError(in_stack_ffffffffffffff70,(string *)in_RDI);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)(local_79 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_79);
  }
  return bVar1;
}

Assistant:

bool Parser::Consume(const char* text) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError("Expected \"" + string(text) + "\".");
    return false;
  }
}